

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

Iterator *
leveldb::NewDBIterator
          (DBImpl *db,Comparator *user_key_comparator,Iterator *internal_iter,
          SequenceNumber sequence,uint32_t seed)

{
  int iVar1;
  Iterator *this;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  this = (Iterator *)operator_new(0xa8);
  Iterator::Iterator(this);
  this->_vptr_Iterator = (_func_int **)&PTR__DBIter_00135090;
  this[1]._vptr_Iterator = (_func_int **)db;
  this[1].cleanup_head_.function = (CleanupFunction)user_key_comparator;
  this[1].cleanup_head_.arg1 = internal_iter;
  this[1].cleanup_head_.arg2 = (void *)sequence;
  this[1].cleanup_head_.next = (CleanupNode *)0x0;
  this[2]._vptr_Iterator = (_func_int **)&this[2].cleanup_head_.arg1;
  this[2].cleanup_head_.function = (CleanupFunction)0x0;
  *(undefined1 *)&this[2].cleanup_head_.arg1 = 0;
  this[2].cleanup_head_.next = &this[3].cleanup_head_;
  this[3]._vptr_Iterator = (_func_int **)0x0;
  *(undefined1 *)&this[3].cleanup_head_.function = 0;
  *(undefined4 *)&this[3].cleanup_head_.arg2 = 0;
  *(undefined1 *)((long)&this[3].cleanup_head_.arg2 + 4) = 0;
  uVar4 = seed & 0x7fffffff;
  if ((uVar4 == 0x7fffffff) || (uVar4 == 0)) {
    uVar4 = 1;
  }
  uVar2 = (uint)((ulong)uVar4 * 0x41a7 >> 0x1f);
  uVar2 = uVar2 << 0x1f | uVar2;
  iVar1 = (int)((ulong)uVar4 * 0x41a7);
  uVar3 = uVar2 + iVar1;
  uVar4 = iVar1 + uVar2 + 0x80000001;
  if (-1 < (int)uVar3) {
    uVar4 = uVar3;
  }
  *(uint *)&this[3].cleanup_head_.next = uVar4;
  this[4]._vptr_Iterator = (_func_int **)(ulong)(uVar4 & 0x1fffff);
  return this;
}

Assistant:

Iterator* NewDBIterator(DBImpl* db, const Comparator* user_key_comparator,
                        Iterator* internal_iter, SequenceNumber sequence,
                        uint32_t seed) {
  return new DBIter(db, user_key_comparator, internal_iter, sequence, seed);
}